

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::SSLClient::process_socket
          (SSLClient *this,Socket *socket,function<bool_(httplib::Stream_&)> *callback)

{
  _Manager_type p_Var1;
  bool bVar2;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type local_50;
  Stream local_40;
  socket_t local_38;
  SSL *local_30;
  time_t local_28;
  time_t local_20;
  time_t local_18;
  time_t local_10;
  
  local_30 = (SSL *)socket->ssl;
  if (local_30 == (SSL *)0x0) {
    __assert_fail("socket.ssl",
                  "/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h"
                  ,0x1fd7,
                  "virtual bool httplib::SSLClient::process_socket(const Socket &, std::function<bool (Stream &)>)"
                 );
  }
  local_38 = socket->sock;
  local_28 = (this->super_ClientImpl).read_timeout_sec_;
  local_20 = (this->super_ClientImpl).read_timeout_usec_;
  local_18 = (this->super_ClientImpl).write_timeout_sec_;
  local_10 = (this->super_ClientImpl).write_timeout_usec_;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (_Manager_type)0x0;
  local_50 = callback->_M_invoker;
  p_Var1 = (callback->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_68._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(callback->super__Function_base)._M_functor;
    local_68._8_8_ = *(undefined8 *)((long)&(callback->super__Function_base)._M_functor + 8);
    (callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    callback->_M_invoker = (_Invoker_type)0x0;
    local_58 = p_Var1;
  }
  local_40._vptr_Stream = (_func_int **)&PTR__Stream_0019fca8;
  SSL_ctrl(local_30,0x4e,4,(void *)0x0);
  if (local_58 != (_Manager_type)0x0) {
    bVar2 = (*local_50)(&local_68,&local_40);
    if (local_58 != (_Manager_type)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
    return bVar2;
  }
  std::__throw_bad_function_call();
}

Assistant:

inline bool
SSLClient::process_socket(const Socket &socket,
                          std::function<bool(Stream &strm)> callback) {
  assert(socket.ssl);
  return detail::process_client_socket_ssl(
      socket.ssl, socket.sock, read_timeout_sec_, read_timeout_usec_,
      write_timeout_sec_, write_timeout_usec_, std::move(callback));
}